

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjCompress(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelSize,
              uchar *jpegBuf,unsigned_long *jpegSize,int jpegSubsamp,int jpegQual,int flags)

{
  uchar *dstBuf;
  int flags_00;
  int pixelFormat;
  int iVar1;
  unsigned_long uVar2;
  unsigned_long local_38;
  
  flags_00 = flags;
  iVar1 = jpegSubsamp;
  dstBuf = jpegBuf;
  if (((uint)flags >> 9 & 1) == 0) {
    pixelFormat = getPixelFormat(pixelSize,flags);
    iVar1 = tjCompress2(handle,srcBuf,width,pitch,height,pixelFormat,&jpegBuf,&local_38,iVar1,
                        jpegQual,flags_00 | 0x400);
    uVar2 = local_38;
  }
  else {
    uVar2 = tjBufSizeYUV(width,height,jpegSubsamp);
    iVar1 = getPixelFormat(pixelSize,flags_00);
    iVar1 = tjEncodeYUV2(handle,srcBuf,width,pitch,height,iVar1,dstBuf,jpegSubsamp,flags_00);
  }
  *jpegSize = uVar2;
  return iVar1;
}

Assistant:

DLLEXPORT int tjCompress(tjhandle handle, unsigned char *srcBuf, int width,
                         int pitch, int height, int pixelSize,
                         unsigned char *jpegBuf, unsigned long *jpegSize,
                         int jpegSubsamp, int jpegQual, int flags)
{
  int retval = 0;
  unsigned long size;

  if (flags & TJ_YUV) {
    size = tjBufSizeYUV(width, height, jpegSubsamp);
    retval = tjEncodeYUV2(handle, srcBuf, width, pitch, height,
                          getPixelFormat(pixelSize, flags), jpegBuf,
                          jpegSubsamp, flags);
  } else {
    retval = tjCompress2(handle, srcBuf, width, pitch, height,
                         getPixelFormat(pixelSize, flags), &jpegBuf, &size,
                         jpegSubsamp, jpegQual, flags | TJFLAG_NOREALLOC);
  }
  *jpegSize = size;
  return retval;
}